

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  short sVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  size_t u;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  
  bVar2 = (byte)tableLog;
  uVar14 = 1;
  uVar10 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d5,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d6,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d7,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar5 = maxSymbolValue + 1;
  lVar3 = (long)wksp + 0x6a;
  uVar11 = uVar10 - 1;
  uVar15 = (uint)(0x8000 << (bVar2 & 0x1f)) >> 0x10;
  uVar13 = uVar11;
  for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
    uVar6 = normalizedCounter[uVar19];
    if (uVar6 == 0xffff) {
      uVar7 = (ulong)uVar13;
      uVar13 = uVar13 - 1;
      dt[uVar7 + 1].baseValue = (U32)uVar19;
      uVar6 = 1;
    }
    else {
      if ((short)uVar6 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x1e5,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar15 < uVar6 || uVar15 == uVar6) {
        uVar14 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar19 * 2) = uVar6;
  }
  dt->nextState = (short)uVar14;
  dt->nbAdditionalBits = (char)((uint)uVar14 >> 0x10);
  dt->nbBits = (char)((uint)uVar14 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar13 == uVar11) {
    iVar12 = (uVar10 >> 1) + (uVar10 >> 3) + 3;
    lVar18 = 0;
    lVar8 = 0;
    for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
      sVar1 = normalizedCounter[uVar13];
      *(long *)((long)wksp + lVar8 + 0x6a) = lVar18;
      for (lVar9 = 0x72; lVar9 + -0x6a < (long)sVar1; lVar9 = lVar9 + 8) {
        *(long *)((long)wksp + lVar9 + lVar8) = lVar18;
      }
      if (sVar1 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x207,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar8 = lVar8 + sVar1;
      lVar18 = lVar18 + 0x101010101010101;
    }
    if ((uVar10 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x215,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar13 = 0;
    for (uVar19 = 0; uVar19 < uVar10; uVar19 = uVar19 + 2) {
      uVar5 = uVar13;
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        dt[(ulong)(uVar5 & uVar11) + 1].baseValue = (uint)*(byte *)(lVar3 + lVar8);
        uVar5 = uVar5 + iVar12;
      }
      uVar13 = uVar13 + iVar12 * 2 & uVar11;
      lVar3 = lVar3 + 2;
    }
    if (uVar13 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x21e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar15 = 0;
    for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
      uVar16 = 0;
      uVar17 = (uint)(ushort)normalizedCounter[uVar19];
      if (normalizedCounter[uVar19] < 1) {
        uVar17 = uVar16;
      }
      for (; uVar16 != uVar17; uVar16 = uVar16 + 1) {
        dt[(ulong)uVar15 + 1].baseValue = (U32)uVar19;
        do {
          uVar15 = uVar15 + (uVar10 >> 1) + (uVar10 >> 3) + 3 & uVar11;
        } while (uVar13 < uVar15);
      }
    }
    if (uVar15 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x22c,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar19 = 0;
  while( true ) {
    if (uVar10 == uVar19) {
      return;
    }
    uVar7 = (ulong)dt[uVar19 + 1].baseValue;
    uVar6 = *(ushort *)((long)wksp + uVar7 * 2);
    *(ushort *)((long)wksp + uVar7 * 2) = uVar6 + 1;
    uVar13 = ZSTD_highbit32((uint)uVar6);
    bVar4 = bVar2 - (char)uVar13;
    dt[uVar19 + 1].nbBits = bVar4;
    dt[uVar19 + 1].nextState = (uVar6 << (bVar4 & 0x1f)) - (short)uVar10;
    if (nbAdditionalBits[uVar7] == 0xff) break;
    dt[uVar19 + 1].nbAdditionalBits = nbAdditionalBits[uVar7];
    dt[uVar19 + 1].baseValue = baseValue[uVar7];
    uVar19 = uVar19 + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                ,0x237,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}